

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

int __thiscall BoardView::EPCCheck(BoardView *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  iterator __begin1;
  undefined4 extraout_var;
  long *plVar12;
  undefined4 extraout_var_00;
  long *plVar13;
  iterator __begin2;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long *plVar18;
  long lVar19;
  byte bVar20;
  byte bVar21;
  int r;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  int epc [2];
  long *plVar11;
  
  epc[0] = 0;
  epc[1] = 0;
  iVar10 = (*this->m_board->_vptr_Board[5])();
  plVar11 = (long *)CONCAT44(extraout_var,iVar10);
  plVar14 = (long *)*plVar11;
  plVar18 = (long *)plVar11[1];
  if (plVar14 == plVar18) {
    iVar10 = 1;
  }
  else {
    fVar26 = 1.1754944e-38;
    for (plVar12 = plVar14; plVar12 != plVar18; plVar12 = plVar12 + 2) {
      fVar23 = *(float *)(*plVar12 + 4);
      if (*(float *)(*plVar12 + 4) <= fVar26) {
        fVar23 = fVar26;
      }
      fVar26 = fVar23;
    }
    for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
      iVar10 = (*this->m_board->_vptr_Board[4])();
      plVar12 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar10))[1];
      plVar13 = (long *)*plVar11;
      plVar18 = (long *)plVar11[1];
      lVar19 = (long)plVar18 - (long)plVar13 >> 4;
      for (plVar14 = *(long **)CONCAT44(extraout_var_00,iVar10); plVar14 != plVar12;
          plVar14 = plVar14 + 2) {
        fVar22 = 0.0;
        fVar23 = 0.0;
        bVar6 = true;
        bVar21 = 0;
        bVar20 = 0;
        for (uVar15 = 0; uVar15 < lVar19 - 1U; uVar15 = uVar15 + 1) {
          pfVar4 = (float *)plVar13[uVar15 * 2];
          pfVar5 = (float *)plVar13[(uVar15 + 1) * 2];
          fVar24 = *pfVar4;
          fVar1 = *pfVar5;
          if ((((fVar24 != fVar1) || (NAN(fVar24) || NAN(fVar1))) || (pfVar4[1] != pfVar5[1])) ||
             (NAN(pfVar4[1]) || NAN(pfVar5[1]))) {
            bVar9 = false;
            bVar8 = false;
            fVar2 = pfVar5[1];
            bVar7 = !bVar6;
            bVar6 = bVar9;
            if (bVar7) {
              if ((fVar23 == fVar1) && (!NAN(fVar23) && !NAN(fVar1))) {
                bVar6 = bVar8;
                if ((fVar22 == fVar2) && ((!NAN(fVar22) && !NAN(fVar2) && (uVar15 < lVar19 - 2U))))
                {
                  fVar23 = *(float *)plVar13[uVar15 * 2 + 4];
                  fVar22 = ((float *)plVar13[uVar15 * 2 + 4])[1];
                  bVar6 = true;
                  uVar15 = uVar15 + 1;
                }
              }
            }
            fVar3 = pfVar4[1];
            if (fVar3 <= fVar2) {
LAB_001101ea:
              if (fVar3 < fVar2) {
                lVar16 = *plVar14;
                fVar25 = *(float *)(lVar16 + 0x54);
                if ((fVar3 < fVar25) && (fVar25 < fVar2)) goto LAB_00110201;
              }
            }
            else {
              lVar16 = *plVar14;
              fVar25 = *(float *)(lVar16 + 0x54);
              if ((fVar3 <= fVar25) || (fVar25 <= fVar2)) goto LAB_001101ea;
LAB_00110201:
              if ((fVar24 != fVar1) || (NAN(fVar24) || NAN(fVar1))) {
                fVar24 = fVar24 + (fVar25 - fVar3) * ((fVar1 - fVar24) / (fVar2 - fVar3));
              }
              if (fVar24 <= *(float *)(lVar16 + 0x50)) {
                if (fVar24 < *(float *)(lVar16 + 0x50)) {
                  bVar20 = bVar20 + 1;
                }
              }
              else {
                bVar21 = bVar21 + 1;
              }
            }
          }
        }
        if (!(bool)((bVar20 | bVar21) & 1)) {
          epc[lVar17] = epc[lVar17] + 1;
        }
      }
      plVar14 = plVar13;
      if (this->debug != false) {
        fprintf(_stderr,"EPC[%d]: %d\n",lVar17,(ulong)(uint)epc[lVar17]);
        plVar13 = (long *)*plVar11;
        plVar18 = (long *)plVar11[1];
        plVar14 = plVar13;
      }
      for (; plVar13 != plVar18; plVar13 = plVar13 + 2) {
        *(float *)(*plVar13 + 4) = fVar26 - *(float *)(*plVar13 + 4);
      }
    }
    iVar10 = 0;
    if (epc[1] < epc[0] && (epc[0] != 0 || epc[1] != 0)) {
      for (; plVar14 != plVar18; plVar14 = plVar14 + 2) {
        *(float *)(*plVar14 + 4) = fVar26 - *(float *)(*plVar14 + 4);
      }
    }
  }
  return iVar10;
}

Assistant:

int BoardView::EPCCheck(void) {
	int epc[2] = {0, 0};
	int side;
	auto &outline = m_board->OutlinePoints();
	ImVec2 min, max;

	if (outline.empty()) {
		return 1;
	};

	// find the orthagonal bounding box
	// probably can put this as a predefined
	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;
	for (auto &p : outline) {
		if (p->x < min.x) min.x = p->x;
		if (p->y < min.y) min.y = p->y;
		if (p->x > max.x) max.x = p->x;
		if (p->y > max.y) max.y = p->y;
	}

	for (side = 0; side < 2; side++) {
		for (auto &p : m_board->Pins()) {
			// auto p = pin.get();
			int l, r;
			int jump = 1;
			Point fp;

			l = 0;
			r = 0;

			for (size_t i = 0; i < outline.size() - 1; i++) {
				Point &pa = *outline[i];
				Point &pb = *outline[i + 1];

				// jump double/dud points
				if (pa.x == pb.x && pa.y == pb.y) continue;

				// if we encounter our hull/poly start point, then we've now created the
				// closed
				// hull, jump the next segment and reset the first-point
				if ((!jump) && (fp.x == pb.x) && (fp.y == pb.y)) {
					if (i < outline.size() - 2) {
						fp   = *outline[i + 2];
						jump = 1;
						i++;
					}
				} else {
					jump = 0;
				}

				// test to see if this segment makes the scan-cut.
				if ((pa.y > pb.y && p->position.y < pa.y && p->position.y > pb.y) ||
				    (pa.y < pb.y && p->position.y > pa.y && p->position.y < pb.y)) {
					ImVec2 intersect;

					intersect.y = p->position.y;
					if (pa.x == pb.x)
						intersect.x = pa.x;
					else
						intersect.x = (pb.x - pa.x) / (pb.y - pa.y) * (p->position.y - pa.y) + pa.x;

					if (intersect.x > p->position.x)
						r++;
					else if (intersect.x < p->position.x)
						l++;
				}
			} // if we did get an intersection

			// If either side has no intersections, then it's out of bounds (likely)
			if ((l % 2 == 0) && (r % 2 == 0)) epc[side]++;
		} // pins

		if (debug) fprintf(stderr, "EPC[%d]: %d\n", side, epc[side]);

		// flip the outline
		for (auto &p : outline) p->y = max.y - p->y;

	} // side

	if ((epc[0] || epc[1]) && (epc[0] > epc[1])) {
		for (auto &p : outline) p->y = max.y - p->y;
	}

	return 0;
}